

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
inja::Parser::add_operator(Parser *this,Arguments *arguments,OperatorStack *operator_stack)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer psVar2;
  ParserError *this_01;
  int iVar3;
  SourceLocation location;
  value_type function;
  shared_ptr<inja::FunctionNode> local_58;
  string local_48;
  
  psVar2 = (operator_stack->c).
           super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar2 == (operator_stack->c).
                super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar2 = (operator_stack->c).
             super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       psVar2[-1].super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       psVar2[-1].super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  std::
  deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
  ::pop_back(&operator_stack->c);
  if ((local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      number_args <=
      (int)((ulong)((long)(arguments->
                          super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(arguments->
                         super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    if (0 < (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            number_args) {
      iVar3 = 0;
      do {
        std::
        vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
        ::insert(&(local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->arguments,
                 ((local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->arguments).
                 super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (arguments->
                 super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1);
        psVar1 = (arguments->
                 super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (arguments->
        super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
        this_00 = psVar1[-1].super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->number_args);
    }
    ::std::
    vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
    ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
              ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                *)arguments,&local_58);
    if (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"too few arguments","");
  this_01 = (ParserError *)__cxa_allocate_exception(0x60);
  location = Lexer::current_position(&this->lexer);
  ParserError::ParserError(this_01,&local_48,location);
  __cxa_throw(this_01,&ParserError::typeinfo,InjaError::~InjaError);
}

Assistant:

inline void add_operator(Arguments &arguments, OperatorStack &operator_stack) {
    auto function = operator_stack.top();
    operator_stack.pop();

    if (static_cast<int>(arguments.size()) < function->number_args) {
      throw_parser_error("too few arguments");
    }

    for (int i = 0; i < function->number_args; ++i) {
      function->arguments.insert(function->arguments.begin(), arguments.back());
      arguments.pop_back();
    }
    arguments.emplace_back(function);
  }